

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O2

void Abc_CexPrintStatsInputs(Abc_Cex_t *p,int nRealPis)

{
  uint uVar1;
  uint uVar2;
  undefined8 in_RAX;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  char *__s;
  uint uVar8;
  uint uVar9;
  
  if (p == (Abc_Cex_t *)0x1) {
    __s = "The counter example is present but not available (pointer has value \"1\").";
  }
  else {
    if (p != (Abc_Cex_t *)0x0) {
      uVar1 = p->nPis;
      if (nRealPis <= (int)uVar1) {
        uVar2 = p->nBits;
        uVar3 = 0;
        uVar6 = 0;
        if (0 < (int)uVar2) {
          uVar6 = uVar2;
        }
        iVar7 = 0;
        uVar9 = 0;
        uVar5 = 0;
        for (; uVar6 != uVar3; uVar3 = uVar3 + 1) {
          uVar8 = (uint)(((uint)(&p[1].iPo)[uVar3 >> 5] >> (uVar3 & 0x1f) & 1) != 0);
          if (uVar1 != nRealPis) {
            if ((int)(uVar3 - p->nRegs) % (int)uVar1 < nRealPis) {
              uVar9 = uVar9 + uVar8;
            }
            else {
              uVar5 = uVar5 + uVar8;
            }
          }
          iVar7 = iVar7 + uVar8;
        }
        printf("CEX: Po =%4d  Fr =%4d  FF = %d  PI = %d  Bit =%7d  1 =%8d (%5.2f %%)",
               ((double)iVar7 * 100.0) / (double)(int)((p->iFrame + 1U) * uVar1),(ulong)(uint)p->iPo
               ,(ulong)(uint)p->iFrame,(ulong)(uint)p->nRegs,(ulong)uVar1,(ulong)uVar2,
               CONCAT44((int)((ulong)in_RAX >> 0x20),iVar7));
        iVar7 = p->nPis - nRealPis;
        if (iVar7 != 0 && nRealPis <= p->nPis) {
          iVar4 = p->iFrame + 1;
          printf(" 1pi =%8d (%5.2f %%) 1ppi =%8d (%5.2f %%)",
                 ((double)(int)uVar9 * 100.0) / (double)(nRealPis * iVar4),
                 ((double)(int)uVar5 * 100.0) / (double)(iVar4 * iVar7),(ulong)uVar9,(ulong)uVar5);
        }
        putchar(10);
        return;
      }
      __assert_fail("nRealPis <= p->nPis",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilCex.c"
                    ,0x120,"void Abc_CexPrintStatsInputs(Abc_Cex_t *, int)");
    }
    __s = "The counter example is NULL.";
  }
  puts(__s);
  return;
}

Assistant:

void Abc_CexPrintStatsInputs( Abc_Cex_t * p, int nRealPis )
{
    int k, Counter = 0, CounterPi = 0, CounterPpi = 0;
    if ( p == NULL )
    {
        printf( "The counter example is NULL.\n" );
        return;
    }
    if ( p == (Abc_Cex_t *)(ABC_PTRINT_T)1 )
    {
        printf( "The counter example is present but not available (pointer has value \"1\").\n" );
        return;
    }
    assert( nRealPis <= p->nPis );
    for ( k = 0; k < p->nBits; k++ )
    {
        Counter += Abc_InfoHasBit(p->pData, k);
        if ( nRealPis == p->nPis )
            continue;
        if ( (k - p->nRegs) % p->nPis < nRealPis )
            CounterPi += Abc_InfoHasBit(p->pData, k);
        else
            CounterPpi += Abc_InfoHasBit(p->pData, k);
    }
    printf( "CEX: Po =%4d  Fr =%4d  FF = %d  PI = %d  Bit =%7d  1 =%8d (%5.2f %%)", 
        p->iPo, p->iFrame, p->nRegs, p->nPis, p->nBits, 
        Counter,  100.0 * Counter    / ((p->iFrame + 1) * p->nPis ) );
    if ( nRealPis < p->nPis )
    {
        printf( " 1pi =%8d (%5.2f %%) 1ppi =%8d (%5.2f %%)", 
            CounterPi,  100.0 * CounterPi  / ((p->iFrame + 1) * nRealPis ), 
            CounterPpi, 100.0 * CounterPpi / ((p->iFrame + 1) * (p->nPis - nRealPis)) );
    }
    printf( "\n" );
}